

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpruneL.c
# Opt level: O3

void dpruneL(int jcol,int *perm_r,int pivrow,int nseg,int *segrep,int *repfnz,int_t *xprune,
            GlobalLU_t *Glu)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int_t *piVar8;
  int_t *piVar9;
  void *pvVar10;
  int_t *piVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  
  if (nseg < 1) {
    return;
  }
  piVar6 = Glu->xsup;
  piVar7 = Glu->supno;
  piVar8 = Glu->lsub;
  piVar9 = Glu->xlsub;
  pvVar10 = Glu->lusup;
  piVar11 = Glu->xlusup;
  iVar2 = piVar7[jcol];
  uVar15 = 0;
LAB_0011184a:
  iVar3 = segrep[uVar15];
  if ((((repfnz[iVar3] != -1) && (iVar4 = piVar7[iVar3], iVar4 != piVar7[(long)iVar3 + 1])) &&
      (iVar4 != iVar2)) && (iVar5 = piVar9[(long)iVar3 + 1], iVar5 <= xprune[iVar3])) {
    iVar14 = piVar9[iVar3];
    if (iVar14 < iVar5) {
      iVar13 = iVar5 + -1;
      lVar16 = 0;
      do {
        if (piVar8[iVar14 + lVar16] == pivrow) {
          iVar4 = piVar6[iVar4];
          goto LAB_001118d3;
        }
        lVar16 = lVar16 + 1;
      } while (iVar5 - iVar14 != (int)lVar16);
    }
  }
  goto LAB_00111953;
LAB_001118d3:
  do {
    if (perm_r[piVar8[iVar13]] == -1) {
LAB_00111942:
      iVar13 = iVar13 + -1;
    }
    else {
      iVar5 = piVar8[iVar14];
      if (perm_r[iVar5] == -1) {
        piVar8[iVar14] = piVar8[iVar13];
        piVar8[iVar13] = iVar5;
        if (iVar3 == iVar4) {
          lVar12 = (long)((piVar11[iVar3] + iVar14) - piVar9[iVar3]);
          uVar1 = *(undefined8 *)((long)pvVar10 + lVar12 * 8);
          lVar16 = (long)((piVar11[iVar3] + iVar13) - piVar9[iVar3]);
          *(undefined8 *)((long)pvVar10 + lVar12 * 8) = *(undefined8 *)((long)pvVar10 + lVar16 * 8);
          *(undefined8 *)((long)pvVar10 + lVar16 * 8) = uVar1;
        }
        iVar14 = iVar14 + 1;
        goto LAB_00111942;
      }
      iVar14 = iVar14 + 1;
    }
  } while (iVar14 <= iVar13);
  xprune[iVar3] = iVar14;
LAB_00111953:
  uVar15 = uVar15 + 1;
  if (uVar15 == (uint)nseg) {
    return;
  }
  goto LAB_0011184a;
}

Assistant:

void
dpruneL(
       const int  jcol,	     /* in */
       const int  *perm_r,   /* in */
       const int  pivrow,    /* in */
       const int  nseg,	     /* in */
       const int  *segrep,   /* in */
       const int  *repfnz,   /* in */
       int_t      *xprune,   /* out */
       GlobalLU_t *Glu       /* modified - global LU data structures */
       )
{

    double     utemp;
    int        jsupno, irep, irep1, kmin, kmax, krow, movnum;
    int_t      i, ktemp, minloc, maxloc;
    int        do_prune; /* logical variable */
    int        *xsup, *supno;
    int_t      *lsub, *xlsub;
    double     *lusup;
    int_t      *xlusup;

    xsup       = Glu->xsup;
    supno      = Glu->supno;
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (double *) Glu->lusup;
    xlusup     = Glu->xlusup;
    
    /*
     * For each supernode-rep irep in U[*,j]
     */
    jsupno = supno[jcol];
    for (i = 0; i < nseg; i++) {

	irep = segrep[i];
	irep1 = irep + 1;
	do_prune = FALSE;

	/* Don't prune with a zero U-segment */
 	if ( repfnz[irep] == SLU_EMPTY )
		continue;

     	/* If a snode overlaps with the next panel, then the U-segment 
   	 * is fragmented into two parts -- irep and irep1. We should let
	 * pruning occur at the rep-column in irep1's snode. 
	 */
	if ( supno[irep] == supno[irep1] ) 	/* Don't prune */
		continue;

	/*
	 * If it has not been pruned & it has a nonz in row L[pivrow,i]
	 */
	if ( supno[irep] != jsupno ) {
	    if ( xprune[irep] >= xlsub[irep1] ) {
		kmin = xlsub[irep];
		kmax = xlsub[irep1] - 1;
		for (krow = kmin; krow <= kmax; krow++) 
		    if ( lsub[krow] == pivrow ) {
			do_prune = TRUE;
			break;
		    }
	    }
	    
    	    if ( do_prune ) {

	     	/* Do a quicksort-type partition
	     	 * movnum=TRUE means that the num values have to be exchanged.
	     	 */
	        movnum = FALSE;
	        if ( irep == xsup[supno[irep]] ) /* Snode of size 1 */
			movnum = TRUE;

	        while ( kmin <= kmax ) {

	    	    if ( perm_r[lsub[kmax]] == SLU_EMPTY ) 
			kmax--;
		    else if ( perm_r[lsub[kmin]] != SLU_EMPTY )
			kmin++;
		    else { /* kmin below pivrow (not yet pivoted), and kmax
                            * above pivrow: interchange the two subscripts
			    */
		        ktemp = lsub[kmin];
		        lsub[kmin] = lsub[kmax];
		        lsub[kmax] = ktemp;

			/* If the supernode has only one column, then we
 			 * only keep one set of subscripts. For any subscript 
			 * interchange performed, similar interchange must be 
			 * done on the numerical values.
 			 */
		        if ( movnum ) {
		    	    minloc = xlusup[irep] + (kmin - xlsub[irep]);
		    	    maxloc = xlusup[irep] + (kmax - xlsub[irep]);
			    utemp = lusup[minloc];
		  	    lusup[minloc] = lusup[maxloc];
			    lusup[maxloc] = utemp;
		        }

		        kmin++;
		        kmax--;

		    }

	        } /* while */

	        xprune[irep] = kmin;	/* Pruning */

#ifdef CHK_PRUNE
	printf("    After dpruneL(),using col %d:  xprune[%d] = %d\n", 
			jcol, irep, kmin);
#endif
	    } /* if do_prune */

	} /* if */

    } /* for each U-segment... */
}